

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

char * opensshcert_alternate_ssh_id(ssh_keyalg *self,uint flags)

{
  ssh_keyalg *psVar1;
  int iVar2;
  char *__s1;
  ssh_keyalg *alg_i;
  size_t i;
  char *base_id;
  uint flags_local;
  ssh_keyalg *self_local;
  
  __s1 = ssh_keyalg_alternate_ssh_id(self->base_alg,flags);
  alg_i = (ssh_keyalg *)0x0;
  while( true ) {
    if ((ssh_keyalg *)0x7 < alg_i) {
      return self->ssh_id;
    }
    psVar1 = opensshcert_all_keyalgs[(long)alg_i];
    iVar2 = strcmp(__s1,psVar1->base_alg->ssh_id);
    if (iVar2 == 0) break;
    alg_i = (ssh_keyalg *)((long)&alg_i->new_pub + 1);
  }
  return psVar1->ssh_id;
}

Assistant:

static const char *opensshcert_alternate_ssh_id(const ssh_keyalg *self,
                                                unsigned flags)
{
    const char *base_id = ssh_keyalg_alternate_ssh_id(self->base_alg, flags);

    for (size_t i = 0; i < lenof(opensshcert_all_keyalgs); i++) {
        const ssh_keyalg *alg_i = opensshcert_all_keyalgs[i];
        if (!strcmp(base_id, alg_i->base_alg->ssh_id))
            return alg_i->ssh_id;
    }

    return self->ssh_id;
}